

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearize.c
# Opt level: O1

void dmrC_kill_insn(dmr_C *C,instruction *insn,int force)

{
  int *piVar1;
  anon_union_24_12_0e8c74c2_for_instruction_7 *usep;
  pseudo_t ppVar2;
  
  if (insn == (instruction *)0x0) {
    return;
  }
  if (insn->bb == (basic_block *)0x0) {
    return;
  }
  switch(*(undefined1 *)insn) {
  case 1:
    goto switchD_00130140_caseD_1;
  case 4:
  case 7:
    usep = (anon_union_24_12_0e8c74c2_for_instruction_7 *)&insn->field_5;
    ppVar2 = (insn->field_5).target;
    (insn->field_5).target = &C->L->void_pseudo;
    goto LAB_00130174;
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
  case 0x1e:
  case 0x1f:
  case 0x20:
  case 0x21:
  case 0x22:
    goto switchD_00130140_caseD_9;
  case 0x23:
  case 0x24:
  case 0x2b:
  case 0x2f:
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x38:
    goto switchD_00130140_caseD_23;
  case 0x25:
  case 0x3f:
    ppVar2 = (insn->field_6).field_6.src3;
    (insn->field_6).field_6.src3 = &C->L->void_pseudo;
    remove_usage(C,ppVar2,&(insn->field_6).field_6.src3);
switchD_00130140_caseD_9:
    ppVar2 = (insn->field_6).field_6.src2;
    (insn->field_6).field_1.bb_false = (basic_block *)&C->L->void_pseudo;
    remove_usage(C,ppVar2,&(insn->field_6).field_6.src2);
    goto switchD_00130140_caseD_23;
  case 0x29:
    if ((force == 0) && ((*(byte *)((long)&insn->type->field_14 + 0x18) & 0x20) != 0)) {
      return;
    }
switchD_00130140_caseD_23:
    usep = &insn->field_6;
    ppVar2 = (insn->field_6).field_4.phi_src;
    (insn->field_6).field_1.bb_true = (basic_block *)&C->L->void_pseudo;
LAB_00130174:
    remove_usage(C,ppVar2,(pseudo_t *)&usep->field_0);
    break;
  case 0x2a:
    if (force == 0) {
      return;
    }
    ppVar2 = (insn->field_6).field_4.phi_src;
    (insn->field_6).field_1.bb_true = (basic_block *)&C->L->void_pseudo;
    remove_usage(C,ppVar2,(pseudo_t *)&(insn->field_6).field_0);
    usep = (anon_union_24_12_0e8c74c2_for_instruction_7 *)&insn->field_5;
    ppVar2 = (insn->field_5).target;
    (insn->field_5).target = &C->L->void_pseudo;
    goto LAB_00130174;
  case 0x2c:
    piVar1 = &C->L->repeat_phase;
    *piVar1 = *piVar1 | 2;
    break;
  case 0x2e:
    kill_use_list(C,(pseudo_list *)(insn->field_6).field_1.bb_true);
    break;
  case 0x35:
    if (force == 0) {
      ppVar2 = (insn->field_6).field_4.phi_src;
      if (ppVar2->type != PSEUDO_SYM) {
        return;
      }
      if ((*(byte *)((long)&((ppVar2->field_5).sym)->field_14 + 0x19) & 0x20) == 0) {
        return;
      }
    }
    kill_use_list(C,(insn->field_6).field_9.arguments);
    ppVar2 = (insn->field_6).field_4.phi_src;
    if (ppVar2->type == PSEUDO_REG) {
      usep = &insn->field_6;
      (usep->field_1).bb_true = (basic_block *)&C->L->void_pseudo;
      goto LAB_00130174;
    }
  }
  insn->bb = (basic_block *)0x0;
  piVar1 = &C->L->repeat_phase;
  *piVar1 = *piVar1 | 1;
switchD_00130140_caseD_1:
  return;
}

Assistant:

void dmrC_kill_insn(struct dmr_C *C, struct instruction *insn, int force)
{
	if (!insn || !insn->bb)
		return;

	switch (insn->opcode) {
	case OP_SEL:
	case OP_RANGE:
		dmrC_kill_use(C, &insn->src3);
		/* fall through */

	case OP_ADD:
	case OP_SUB:
	case OP_MULU: 
	case OP_MULS:
	case OP_DIVU: 
	case OP_DIVS:
	case OP_MODU: 
	case OP_MODS:
	case OP_SHL:
	case OP_LSR: 
	case OP_ASR:

		/* Logical */
	case OP_AND:
	case OP_OR:
	case OP_XOR:
	case OP_AND_BOOL:
	case OP_OR_BOOL:

	case OP_SET_EQ:
	case OP_SET_NE:
	case OP_SET_LE:
	case OP_SET_GE:
	case OP_SET_LT:
	case OP_SET_GT:
	case OP_SET_B:
	case OP_SET_A:
	case OP_SET_BE:
	case OP_SET_AE:
		dmrC_kill_use(C, &insn->src2);
		/* fall through */

	case OP_CAST:
	case OP_SCAST:
	case OP_FPCAST:
	case OP_PTRCAST:
	case OP_SETVAL:
	case OP_NOT: case OP_NEG:
	case OP_SLICE:
		dmrC_kill_use(C, &insn->src1);
		break;

	case OP_PHI:
		kill_use_list(C, insn->phi_list);
		break;
	case OP_PHISOURCE:
		dmrC_kill_use(C, &insn->phi_src);
		break;

	case OP_SYMADDR:
		C->L->repeat_phase |= REPEAT_SYMBOL_CLEANUP;
		break;

	case OP_CBR:
		/* fall through */
	case OP_COMPUTEDGOTO:
		dmrC_kill_use(C, &insn->cond);
		break;

	case OP_CALL:
		if (!force) {
			/* a "pure" function can be killed too */
			if (!(insn->func->type == PSEUDO_SYM))
				return;
			if (!(insn->func->sym->ctype.modifiers & MOD_PURE))
				return;
		}
		kill_use_list(C, insn->arguments);
		if (insn->func->type == PSEUDO_REG)
			dmrC_kill_use(C, &insn->func);
		break;

	case OP_LOAD:
		if (!force && insn->type->ctype.modifiers & MOD_VOLATILE)
			return;
		dmrC_kill_use(C, &insn->src);
		break;

	case OP_STORE:
		if (!force)
			return;
		dmrC_kill_use(C, &insn->src);
		dmrC_kill_use(C, &insn->target);
		break;

	case OP_ENTRY:
		/* ignore */
		return;

	case OP_BR:
	default:
		break;
	}

	insn->bb = NULL;
	C->L->repeat_phase |= REPEAT_CSE;
	return;
}